

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O2

ssize_t __thiscall
QNetworkAccessFileBackend::read
          (QNetworkAccessFileBackend *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  Operation OVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  long lStack_b0;
  QArrayDataPointer<char16_t> QStack_a8;
  QNetworkAccessBackend local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if (OVar2 == GetOperation) {
    lStack_b0 = QIODevice::read((char *)(this + 0x10),CONCAT44(in_register_00000034,__fd));
    if (lStack_b0 < 1) {
      iVar3 = QFileDevice::error();
      if (iVar3 == 0) {
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
      }
      else {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  ((char *)&local_70,"QNetworkAccessFileBackend","Read error reading from %1: %2",0)
        ;
        QNetworkAccessBackend::url(local_90);
        QUrl::toString(&local_88,local_90,0);
        QIODevice::errorString();
        QString::arg<QString,QString>
                  ((type *)&local_58,(QString *)&local_70,(QString *)&local_88,(QString *)&QStack_a8
                  );
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QUrl::~QUrl((QUrl *)local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        QNetworkAccessBackend::error
                  ((QNetworkAccessBackend *)this,ProtocolFailure,(QString *)&local_58);
        QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        lStack_b0 = -1;
      }
    }
    else {
      cVar1 = QFileDevice::isSequential();
      if (cVar1 == '\0') {
        cVar1 = QFileDevice::atEnd();
        if (cVar1 != '\0') {
          QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
        }
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + lStack_b0;
    }
  }
  else {
    lStack_b0 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lStack_b0;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkAccessFileBackend::read(char *data, qint64 maxlen)
{
    if (operation() != QNetworkAccessManager::GetOperation)
        return 0;
    qint64 actuallyRead = file.read(data, maxlen);
    if (actuallyRead <= 0) {
        // EOF or error
        if (file.error() != QFile::NoError) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Read error reading from %1: %2")
                            .arg(url().toString(), file.errorString());
            error(QNetworkReply::ProtocolFailure, msg);

            finished();
            return -1;
        }

        finished();
        return actuallyRead;
    }
    if (!file.isSequential() && file.atEnd())
        finished();
    totalBytes += actuallyRead;
    return actuallyRead;
}